

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O0

uint64_t bitmanip::detail::remIleavedBits_naive(uint64_t input,size_t bits)

{
  byte bVar1;
  size_t b_out;
  size_t i;
  uint64_t result;
  size_t bits_local;
  uint64_t input_local;
  
  i = 0;
  bVar1 = 0;
  bits_local = input;
  for (b_out = 0; b_out < 0x40; b_out = b_out + 1) {
    if (b_out % (bits + 1) == 0) {
      i = (bits_local & 1) << (bVar1 & 0x3f) | i;
      bVar1 = bVar1 + 1;
    }
    bits_local = bits_local >> 1;
  }
  return i;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t remIleavedBits_naive(std::uint64_t input, std::size_t bits) noexcept
{
    // increment once to avoid modulo divisions by 0
    // this way our function is noexcept and safe for all inputs
    ++bits;
    std::uint64_t result = 0;
    for (std::size_t i = 0, b_out = 0; i < 64; ++i) {
        if (i % bits == 0) {
            result |= (input & 1) << b_out++;
        }
        input >>= 1;
    }

    return result;
}